

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

void zzDiv(word *q,word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  int iVar1;
  word wVar2;
  word *b_00;
  word *a_00;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *in_R9;
  word *mul;
  word *divisor;
  word *divident;
  size_t i;
  word t;
  size_t shift;
  dword qhat;
  word *b_01;
  size_t in_stack_ffffffffffffff98;
  word *in_stack_ffffffffffffffa0;
  word in_stack_ffffffffffffffa8;
  word *in_stack_ffffffffffffffb0;
  word *in_stack_ffffffffffffffb8;
  word *in_stack_ffffffffffffffc0;
  
  iVar1 = wwCmp2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
  if (iVar1 < 0) {
    wwSetZero(in_RDI,(long)in_RCX + (1 - (long)in_R9));
    wwCopy(in_RSI,in_RDX,(size_t)in_R9);
  }
  else if (in_R9 == (word *)0x1) {
    wVar2 = zzDivW(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (size_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    *in_RSI = wVar2;
  }
  else {
    b_01 = divisor + (long)in_RCX + 1;
    b_00 = b_01 + (long)in_R9;
    wwCopy(divisor,in_RDX,(size_t)in_RCX);
    divisor[(long)in_RCX] = 0;
    wwCopy(b_01,in_R8,(size_t)in_R9);
    a_00 = (word *)u64CLZ(0x17035a);
    wwShHi(in_stack_ffffffffffffffa0,(size_t)divisor,(size_t)b_01);
    wwShHi(in_stack_ffffffffffffffa0,(size_t)divisor,(size_t)b_01);
    for (; in_R9 <= in_RCX; in_RCX = (word *)((long)in_RCX + -1)) {
      if (divisor[(long)in_RCX] == b_01[(long)in_R9 - 1]) {
        in_RDI[(long)in_RCX - (long)in_R9] = 0xffffffffffffffff;
      }
      else {
        wVar2 = __udivti3(divisor[(long)in_RCX + -1],divisor[(long)in_RCX],b_01[(long)in_R9 - 1],0);
        in_RDI[(long)in_RCX - (long)in_R9] = wVar2;
      }
      wwCopy(b_00,b_01 + ((long)in_R9 - 2),2);
      wVar2 = zzMulW(b_00,b_00,2,in_RDI[(long)in_RCX - (long)in_R9]);
      b_00[2] = wVar2;
      while( true ) {
        iVar1 = wwCmp2(a_00,in_stack_ffffffffffffffa8,in_RCX,(size_t)divisor);
        if (iVar1 < 1) break;
        in_RDI[(long)in_RCX - (long)in_R9] = in_RDI[(long)in_RCX - (long)in_R9] - 1;
        wVar2 = zzSub2(b_00,b_01 + ((long)in_R9 - 2),2);
        b_00[2] = b_00[2] - wVar2;
      }
      in_stack_ffffffffffffffa8 =
           zzSubMulW(divisor + ((long)in_RCX - (long)in_R9),b_01,(size_t)in_R9,
                     in_RDI[(long)in_RCX - (long)in_R9]);
      divisor[(long)in_RCX] = divisor[(long)in_RCX] - in_stack_ffffffffffffffa8;
      if ((in_stack_ffffffffffffffa8 ^ 0xffffffffffffffff) < divisor[(long)in_RCX]) {
        in_RDI[(long)in_RCX - (long)in_R9] = in_RDI[(long)in_RCX - (long)in_R9] - 1;
        wVar2 = zzAdd2(divisor + ((long)in_RCX - (long)in_R9),b_01,(size_t)in_R9);
        divisor[(long)in_RCX] = wVar2 + divisor[(long)in_RCX];
      }
    }
    wwShLo(in_RCX,(size_t)divisor,(size_t)b_01);
    wwCopy(in_RSI,divisor,(size_t)in_R9);
  }
  return;
}

Assistant:

void zzDiv(word q[], word r[], const word a[], size_t n, const word b[],
	size_t m, void* stack)
{
	register dword qhat;
	register size_t shift;
	register word t;
	size_t i;
	// переменные в stack
	word* divident;		/*< нормализованное делимое (n + 1 слово) */
	word* divisor;		/*< нормализованный делитель (m слов) */
	word* mul;			/*< вспомогательное произведение (3 слова) */
	// pre
	ASSERT(n >= m);
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(wwIsDisjoint2(q, n + 1 - m, r, m));
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// a < b?
	if (wwCmp2(a, n, b, m) < 0)
	{
		// q <- 0, r <- a
		wwSetZero(q, n - m + 1);
		wwCopy(r, a, m);
		return;
	}
	// делим на одноразрядное число?
	if (m == 1)
	{
		r[0] = zzDivW(q, a, n, b[0]);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	mul = divisor + m;
	stack = mul + 3;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация
	shift = wordCLZ(b[m - 1]);
	wwShHi(divident, n + 1, shift);
	wwShHi(divisor, m, shift);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// вычислить пробное частное
		if (divident[i] == divisor[m - 1])
			q[i - m] = WORD_MAX;
		else
		{
			qhat = divident[i];
			qhat <<= B_PER_W;
			qhat |= divident[i - 1];
			qhat /= divisor[m - 1];
			q[i - m] = (word)qhat;
		}
		// уточнить пробное частное
		wwCopy(mul, divisor + m - 2, 2);
		mul[2] = zzMulW(mul, mul, 2, q[i - m]);
		while (wwCmp2(mul, 3, divident + i - 2, 3) > 0)
		{
			q[i - m]--;
			mul[2] -= zzSub2(mul, divisor + m - 2, 2);
		}
		// учесть пробное частное
		t = zzSubMulW(divident + i - m, divisor, m, q[i - m]);
		divident[i] -= t;
		if (divident[i] > (word)~t)
		{
			// окончательно подправить пробное частное
			q[i - m]--;
			// корректирующее сложение
			divident[i] += zzAdd2(divident + i - m, divisor, m);
		}
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	t = 0, shift = 0, qhat = 0;
}